

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint32 Hash32Len13to24(char *s,size_t len)

{
  uint32 uVar1;
  uint32 a_00;
  uint32 a_01;
  uint32 a_02;
  uint32 a_03;
  uint32 a_04;
  uint32 h;
  uint32 f;
  uint32 e;
  uint32 d;
  uint32 c;
  uint32 b;
  uint32 a;
  size_t len_local;
  char *s_local;
  
  uVar1 = Fetch32(s + ((len >> 1) - 4));
  a_00 = Fetch32(s + 4);
  a_01 = Fetch32(s + (len - 8));
  a_02 = Fetch32(s + (len >> 1));
  a_03 = Fetch32(s);
  a_04 = Fetch32(s + (len - 4));
  uVar1 = Mur(uVar1,(uint32)len);
  uVar1 = Mur(a_00,uVar1);
  uVar1 = Mur(a_01,uVar1);
  uVar1 = Mur(a_02,uVar1);
  uVar1 = Mur(a_03,uVar1);
  uVar1 = Mur(a_04,uVar1);
  uVar1 = fmix(uVar1);
  return uVar1;
}

Assistant:

static uint32 Hash32Len13to24(const char *s, size_t len) {
  uint32 a = Fetch32(s - 4 + (len >> 1));
  uint32 b = Fetch32(s + 4);
  uint32 c = Fetch32(s + len - 8);
  uint32 d = Fetch32(s + (len >> 1));
  uint32 e = Fetch32(s);
  uint32 f = Fetch32(s + len - 4);
  uint32 h = len;

  return fmix(Mur(f, Mur(e, Mur(d, Mur(c, Mur(b, Mur(a, h)))))));
}